

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O3

void njd_set_digit(NJD *njd)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  NJDNode *pNVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  _NJDNode *p_Var8;
  byte bVar9;
  uint uVar10;
  _NJDNode *p_Var11;
  NJDNode *pNVar12;
  char **ppcVar13;
  NJDNode *pNVar14;
  _NJDNode **pp_Var15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  NJDNode *local_58;
  
  pNVar12 = njd->head;
  if (pNVar12 == (NJDNode *)0x0) {
    return;
  }
  bVar17 = false;
  p_Var8 = (NJDNode *)0x0;
  do {
    bVar19 = !bVar17;
    bVar17 = true;
    if (bVar19) {
      pcVar3 = NJDNode_get_pos_group1(pNVar12);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
      bVar17 = iVar1 == 0;
    }
    iVar1 = get_digit(pNVar12,1);
    if (iVar1 < 0) {
      pcVar3 = NJDNode_get_pos_group1(pNVar12);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
      if (iVar1 == 0) {
        pcVar3 = NJDNode_get_string(pNVar12);
        iVar1 = is_period(pcVar3);
        if ((iVar1 != 0) ||
           ((pcVar3 = NJDNode_get_string(pNVar12), pcVar3 != (char *)0x0 &&
            (iVar1 = strcmp(pcVar3,anon_var_dwarf_1c00), iVar1 == 0)))) goto LAB_00148843;
      }
      if (p_Var8 == (NJDNode *)0x0) goto LAB_00148fa0;
      pNVar14 = pNVar12->prev;
      if (pNVar12->prev != (NJDNode *)0x0) goto LAB_00148898;
    }
    else {
LAB_00148843:
      if (p_Var8 == (NJDNode *)0x0) {
        p_Var8 = pNVar12;
      }
      pNVar14 = pNVar12;
      if (pNVar12 == njd->tail) {
LAB_00148898:
        do {
          pcVar3 = NJDNode_get_string(p_Var8);
          local_58 = p_Var8;
          if ((pcVar3 == (char *)0x0) || (iVar1 = strcmp(pcVar3,anon_var_dwarf_1c00), iVar1 != 0)) {
            pcVar3 = NJDNode_get_string(p_Var8);
            iVar1 = is_period(pcVar3);
            if (iVar1 == 0) {
              bVar19 = true;
              if (p_Var8 != pNVar14 && p_Var8->next != (NJDNode *)0x0) {
                pcVar3 = NJDNode_get_string(p_Var8->next);
                iVar1 = is_period(pcVar3);
                if (iVar1 == 0) {
                  do {
                    local_58 = local_58->next;
                    if ((local_58 == pNVar14) || (local_58->next == (NJDNode *)0x0)) break;
                    pcVar3 = NJDNode_get_string(local_58->next);
                    iVar1 = is_period(pcVar3);
                  } while (iVar1 == 0);
                  bVar19 = local_58 == p_Var8;
                  if ((!bVar19) && (local_58->prev != (_NJDNode *)0x0)) {
                    while( true ) {
                      pcVar3 = NJDNode_get_string(local_58);
                      if ((pcVar3 == (char *)0x0) ||
                         (iVar1 = strcmp(pcVar3,anon_var_dwarf_1c00), iVar1 != 0)) break;
                      local_58 = local_58->prev;
                      bVar19 = local_58 == p_Var8;
                      if ((bVar19) || (local_58->prev == (_NJDNode *)0x0)) goto LAB_00148911;
                    }
                    bVar19 = false;
                  }
                }
              }
LAB_00148911:
              iVar1 = 0;
              uVar10 = 1;
              pNVar4 = (NJDNode *)0x0;
              uVar7 = 0;
              p_Var11 = local_58;
              while( true ) {
                pcVar3 = NJDNode_get_string(p_Var11);
                if ((pcVar3 == (char *)0x0) ||
                   (iVar2 = strcmp(pcVar3,anon_var_dwarf_1c00), iVar2 != 0)) {
                  if (uVar10 == 0) {
                    bVar18 = false;
                  }
                  else {
                    bVar18 = (~uVar7 & 3) != 0;
                  }
                }
                else {
                  iVar1 = iVar1 + 1;
                  bVar18 = uVar10 != 0 && (~uVar7 & 3) == 0;
                  pNVar4 = p_Var11;
                }
                uVar10 = (uint)bVar18;
                if (p_Var11 == p_Var8) break;
                p_Var11 = p_Var11->prev;
                uVar7 = uVar7 + 1;
              }
              if (!bVar19) {
                iVar2 = get_digit(p_Var8,0);
                uVar10 = uVar10 | -(uint)(iVar2 == 0);
              }
              if (uVar10 == 1 && iVar1 == 0) {
                uVar10 = 0;
              }
              if (uVar10 == 1) {
                pNVar4 = p_Var8;
                if (p_Var8 != local_58 && 0 < iVar1) {
                  do {
                    pcVar3 = NJDNode_get_string(pNVar4);
                    if ((pcVar3 == (char *)0x0) ||
                       (iVar1 = strcmp(pcVar3,anon_var_dwarf_1c00), iVar1 != 0)) {
                      pNVar4 = pNVar4->next;
                    }
                    else {
                      pNVar4 = NJD_remove_node(njd,pNVar4);
                    }
                  } while (pNVar4 != local_58);
                }
                convert_digit_sequence_for_numerical_reading(p_Var8,local_58);
              }
              else {
                if (pNVar4 != (NJDNode *)0x0) {
                  local_58 = pNVar4->prev;
                }
                if (uVar10 == 0) {
                  if (p_Var8->prev == (NJDNode *)0x0) {
                    uVar7 = 0;
                  }
                  else {
                    pcVar3 = NJDNode_get_pos_group1(p_Var8->prev);
                    pcVar5 = NJDNode_get_pos_group2(p_Var8->prev);
                    pcVar6 = NJDNode_get_string(p_Var8->prev);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_129173);
                    uVar7 = (uint)(iVar1 == 0) * 2;
                    iVar1 = strcmp(pcVar5,anon_var_dwarf_128d14);
                    if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,anon_var_dwarf_128d2b), iVar1 == 0))
                    {
                      uVar7 = uVar7 | 1;
                    }
                    uVar10 = uVar7;
                    if (pcVar6 != (char *)0x0) {
                      iVar1 = is_period(pcVar6);
                      if (iVar1 == 0) {
                        iVar1 = strcmp(pcVar6,anon_var_dwarf_12917d);
                        if ((((iVar1 != 0) &&
                             (iVar1 = strcmp(pcVar6,anon_var_dwarf_1c14), iVar1 != 0)) &&
                            (iVar1 = strcmp(pcVar6,anon_var_dwarf_129191), iVar1 != 0)) &&
                           ((iVar1 = strcmp(pcVar6,anon_var_dwarf_12919b), iVar1 != 0 &&
                            (iVar1 = strcmp(pcVar6,anon_var_dwarf_1291a5), iVar1 != 0)))) {
                          iVar1 = strcmp(pcVar6,anon_var_dwarf_1bb0);
                          if (iVar1 == 0) {
                            pNVar4 = p_Var8->prev->prev;
                            if (pNVar4 == (NJDNode *)0x0) goto LAB_00148da3;
                            pcVar6 = NJDNode_get_pos_group1(pNVar4);
                            pcVar3 = anon_var_dwarf_12a8a7 + 9;
                          }
                          else {
                            iVar1 = strcmp(pcVar6,anon_var_dwarf_1bc4);
                            if (iVar1 == 0) goto LAB_00148d69;
                            pcVar3 = anon_var_dwarf_1291c3;
                          }
                          iVar1 = strcmp(pcVar6,pcVar3);
                          uVar10 = uVar7 - 2;
                          goto LAB_00148cc0;
                        }
LAB_00148d69:
                        uVar10 = uVar7 - 2;
                      }
                      else {
                        pNVar4 = p_Var8->prev->prev;
                        if (pNVar4 != (NJDNode *)0x0) {
                          pcVar3 = NJDNode_get_pos_group1(pNVar4);
                          iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
                          uVar10 = uVar7 - 5;
LAB_00148cc0:
                          if (iVar1 != 0) {
                            uVar10 = uVar7;
                          }
                        }
                      }
                    }
LAB_00148da3:
                    pNVar4 = p_Var8->prev->prev;
                    uVar7 = uVar10;
                    if (pNVar4 != (NJDNode *)0x0) {
                      pcVar3 = NJDNode_get_string(pNVar4);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_1291c3);
                      uVar7 = uVar10 - 2;
                      if (iVar1 != 0) {
                        uVar7 = uVar10;
                      }
                    }
                  }
                  uVar10 = uVar7;
                  if (local_58->next != (NJDNode *)0x0) {
                    pcVar3 = NJDNode_get_pos_group1(local_58->next);
                    pcVar5 = NJDNode_get_pos_group2(local_58->next);
                    pcVar6 = NJDNode_get_string(local_58->next);
                    iVar1 = strcmp(pcVar5,anon_var_dwarf_128d14);
                    if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,anon_var_dwarf_128d2b), iVar1 == 0))
                    {
                      uVar7 = uVar7 + 2;
                    }
                    uVar10 = uVar7;
                    if (pcVar6 != (char *)0x0) {
                      iVar1 = strcmp(pcVar6,anon_var_dwarf_12917d);
                      if ((((iVar1 == 0) || (iVar1 = strcmp(pcVar6,anon_var_dwarf_1c14), iVar1 == 0)
                           ) || (iVar1 = strcmp(pcVar6,anon_var_dwarf_129191), iVar1 == 0)) ||
                         (((iVar1 = strcmp(pcVar6,anon_var_dwarf_12919b), iVar1 == 0 ||
                           (iVar1 = strcmp(pcVar6,anon_var_dwarf_1291a5), iVar1 == 0)) ||
                          (iVar1 = strcmp(pcVar6,anon_var_dwarf_1bb0), iVar1 == 0)))) {
LAB_00148f2c:
                        uVar10 = uVar7 - 2;
                      }
                      else {
                        iVar1 = strcmp(pcVar6,anon_var_dwarf_1bc4);
                        if (iVar1 == 0) {
                          pNVar4 = local_58->next->next;
                          if (pNVar4 != (NJDNode *)0x0) {
                            pcVar3 = NJDNode_get_pos_group1(pNVar4);
                            iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
                            uVar10 = uVar7 - 2;
                            if (iVar1 != 0) {
                              uVar10 = uVar7;
                            }
                          }
                        }
                        else {
                          iVar1 = strcmp(pcVar6,anon_var_dwarf_1291c3);
                          if (iVar1 == 0) goto LAB_00148f2c;
                          iVar1 = is_period(pcVar6);
                          uVar10 = uVar7 + 4;
                          if (iVar1 == 0) {
                            uVar10 = uVar7;
                          }
                        }
                      }
                    }
                  }
                  if (-1 < (int)uVar10) {
                    convert_digit_sequence_for_numerical_reading(p_Var8,local_58);
                    goto joined_r0x00148f5a;
                  }
                }
                if (local_58->next != p_Var8) {
                  iVar1 = 1;
                  pNVar4 = p_Var8;
                  do {
                    pNVar4 = pNVar4->next;
                    iVar1 = iVar1 + -1;
                  } while (pNVar4 != local_58->next);
                  if (iVar1 != 0) {
                    bVar9 = 0;
                    do {
                      pcVar3 = NJDNode_get_string(p_Var8);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_128ca5);
                      pcVar3 = anon_var_dwarf_1291cd;
                      if (iVar1 == 0) {
LAB_00148afb:
                        NJDNode_set_pron(p_Var8,pcVar3);
                        NJDNode_set_mora_size(p_Var8,2);
                      }
                      else {
                        pcVar3 = NJDNode_get_string(p_Var8);
                        iVar1 = strcmp(pcVar3,anon_var_dwarf_1c50);
                        pcVar3 = anon_var_dwarf_1291cd;
                        if (iVar1 == 0) goto LAB_00148afb;
                        pcVar3 = NJDNode_get_string(p_Var8);
                        iVar1 = strcmp(pcVar3,anon_var_dwarf_128cd2);
                        pcVar3 = anon_var_dwarf_12a3ec + 3;
                        if (iVar1 == 0) goto LAB_00148afb;
                        pcVar3 = NJDNode_get_string(p_Var8);
                        iVar1 = strcmp(pcVar3,anon_var_dwarf_128ce8);
                        pcVar3 = anon_var_dwarf_128cf3;
                        if (iVar1 == 0) goto LAB_00148afb;
                      }
                      NJDNode_set_chain_rule(p_Var8,(char *)0x0);
                      if ((bool)(bVar9 & 1)) {
                        NJDNode_set_chain_flag(p_Var8,1);
                        NJDNode_set_acc(p_Var8->prev,3);
                      }
                      else {
                        NJDNode_set_chain_flag(p_Var8,0);
                      }
                      bVar9 = bVar9 + 1;
                      p_Var8 = p_Var8->next;
                    } while (p_Var8 != local_58->next);
                  }
                }
              }
            }
          }
joined_r0x00148f5a:
        } while ((local_58 != pNVar14) && (p_Var8 = local_58->next, p_Var8 != (_NJDNode *)0x0));
LAB_00148fa0:
        p_Var8 = (NJDNode *)0x0;
      }
    }
    pNVar12 = pNVar12->next;
  } while (pNVar12 != (_NJDNode *)0x0);
  if (!bVar17) {
    return;
  }
  NJD_remove_silent_node(njd);
  p_Var8 = njd->head;
  if (p_Var8 == (NJDNode *)0x0) {
    return;
  }
  p_Var11 = p_Var8->next;
  if (p_Var11 == (_NJDNode *)0x0) goto LAB_0014965f;
  do {
    if (p_Var11->next == (_NJDNode *)0x0) break;
    pp_Var15 = &p_Var11->next;
    pcVar3 = NJDNode_get_string(p_Var11);
    if (((*pcVar3 != '*') || (pcVar3[1] != '\0')) &&
       ((pcVar3 = NJDNode_get_string(p_Var11->prev), *pcVar3 != '*' || (pcVar3[1] != '\0')))) {
      pcVar3 = NJDNode_get_string(p_Var11);
      iVar1 = is_period(pcVar3);
      if (iVar1 != 0) {
        pcVar3 = NJDNode_get_pos_group1(p_Var11->prev);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
        if (iVar1 == 0) {
          pcVar3 = NJDNode_get_pos_group1(*pp_Var15);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
          if (iVar1 == 0) {
            NJDNode_load(p_Var11,anon_var_dwarf_128c8e);
            NJDNode_set_chain_flag(p_Var11,1);
            pcVar3 = NJDNode_get_string(p_Var11->prev);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_128ca5);
            if (iVar1 == 0) {
LAB_0014918a:
              pNVar12 = p_Var11->prev;
              pcVar3 = anon_var_dwarf_128cbb;
LAB_00149195:
              NJDNode_set_pron(pNVar12,pcVar3);
              NJDNode_set_mora_size(p_Var11->prev,2);
            }
            else {
              pcVar3 = NJDNode_get_string(p_Var11->prev);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_1c50);
              if (iVar1 == 0) goto LAB_0014918a;
              pcVar3 = NJDNode_get_string(p_Var11->prev);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_128cd2);
              pNVar12 = p_Var11->prev;
              if (iVar1 == 0) {
                pcVar3 = anon_var_dwarf_12a3ec + 3;
                goto LAB_00149195;
              }
              pcVar3 = NJDNode_get_string(pNVar12);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_128ce8);
              pNVar12 = p_Var11->prev;
              if (iVar1 == 0) {
                pcVar3 = anon_var_dwarf_128cf3;
                goto LAB_00149195;
              }
              pcVar3 = NJDNode_get_string(pNVar12);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_128cfe);
              if (iVar1 == 0) {
                NJDNode_set_acc(p_Var11->prev,1);
              }
            }
            do {
              pNVar12 = *pp_Var15;
              if (pNVar12 == (NJDNode *)0x0) goto LAB_001491fc;
              pcVar3 = NJDNode_get_pos(pNVar12);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_12e4b7 + 0xd);
              pp_Var15 = &pNVar12->next;
            } while (iVar1 == 0);
          }
        }
      }
    }
    p_Var11 = *pp_Var15;
  } while (p_Var11 != (_NJDNode *)0x0);
LAB_001491fc:
  p_Var8 = njd->head;
  p_Var11 = p_Var8->next;
  if (p_Var11 != (_NJDNode *)0x0) {
    do {
      pcVar3 = NJDNode_get_pos_group1(p_Var11->prev);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
      if (iVar1 == 0) {
        pcVar3 = NJDNode_get_pos_group2(p_Var11);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_128d14);
        if (iVar1 != 0) {
          pcVar3 = NJDNode_get_pos_group1(p_Var11);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_128d2b);
          if (iVar1 != 0) goto LAB_0014945f;
        }
        iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1b,p_Var11);
        ppcVar13 = njd_set_digit_rule_conv_table1b;
        if (iVar1 == 0) {
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1c1,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1c1;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1c2,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1c2;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1d,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1d;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1e,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1e;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1f,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1f;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1g,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1g;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1h,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1h;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1i,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1i;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1j,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1j;
          if (iVar1 != 0) goto LAB_001493b8;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1k,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table1k;
          if (iVar1 != 0) goto LAB_001493b8;
        }
        else {
LAB_001493b8:
          convert_digit_pron(ppcVar13,p_Var11->prev);
        }
        iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2b,p_Var11);
        ppcVar13 = njd_set_digit_rule_conv_table2b;
        if (iVar1 == 0) {
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2c,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table2c;
          if (iVar1 != 0) goto LAB_0014943b;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2d,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table2d;
          if (iVar1 != 0) goto LAB_0014943b;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2e,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table2e;
          if (iVar1 != 0) goto LAB_0014943b;
          iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2f,p_Var11);
          ppcVar13 = njd_set_digit_rule_conv_table2f;
          if (iVar1 != 0) goto LAB_0014943b;
        }
        else {
LAB_0014943b:
          convert_numerative_pron(ppcVar13,p_Var11->prev,p_Var11);
        }
        NJDNode_set_chain_flag(p_Var11->prev,0);
        NJDNode_set_chain_flag(p_Var11,1);
      }
LAB_0014945f:
      p_Var11 = p_Var11->next;
    } while (p_Var11 != (_NJDNode *)0x0);
    p_Var8 = njd->head;
    p_Var11 = p_Var8->next;
    if (p_Var11 != (_NJDNode *)0x0) {
LAB_0014949d:
      pcVar3 = NJDNode_get_pos_group1(p_Var11->prev);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
      if (iVar1 == 0) {
        pcVar3 = NJDNode_get_pos_group1(p_Var11);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
        if (((iVar1 == 0) && (pcVar3 = NJDNode_get_string(p_Var11->prev), pcVar3 != (char *)0x0)) &&
           (pcVar3 = NJDNode_get_string(p_Var11), pcVar3 != (char *)0x0)) {
          lVar16 = 0;
          do {
            pcVar3 = NJDNode_get_string(p_Var11->prev);
            iVar1 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list4 + lVar16));
            if (iVar1 == 0) {
              lVar16 = 0;
              goto LAB_00149594;
            }
            lVar16 = lVar16 + 8;
          } while (lVar16 != 0x60);
          goto LAB_001495b9;
        }
        goto LAB_001494cc;
      }
      goto LAB_00149534;
    }
  }
LAB_0014963a:
  if (p_Var8 != (NJDNode *)0x0) {
LAB_0014965f:
    if (p_Var8->next != (NJDNode *)0x0) {
      pcVar3 = NJDNode_get_string(p_Var8->next);
      if ((*pcVar3 != '*') || (pcVar3[1] != '\0')) {
        pcVar3 = NJDNode_get_pos_group1(p_Var8);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
        if (iVar1 != 0) goto LAB_00149693;
        if (p_Var8->prev != (NJDNode *)0x0) {
          pcVar3 = NJDNode_get_pos(p_Var8->prev);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_1273ee);
          if (iVar1 != 0) {
            pcVar3 = NJDNode_get_pos_group1(p_Var8->prev);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
            if (iVar1 == 0) goto LAB_00149693;
          }
        }
        pcVar3 = NJDNode_get_pos_group2(p_Var8->next);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_128d14);
        if (iVar1 != 0) {
          pcVar3 = NJDNode_get_pos_group1(p_Var8->next);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_128d2b);
          if (iVar1 != 0) goto LAB_00149693;
        }
        lVar16 = 1;
        do {
          pcVar3 = NJDNode_get_string(p_Var8->next);
          iVar1 = strcmp(pcVar3,*(char **)(&UNK_00175508 + lVar16 * 8));
          if (iVar1 == 0) {
            pcVar3 = NJDNode_get_read(p_Var8->next);
            iVar1 = strcmp(pcVar3,njd_set_digit_rule_numerative_class3[lVar16]);
            if (iVar1 == 0) {
              lVar16 = 0;
              goto LAB_0014979e;
            }
          }
          lVar16 = lVar16 + 2;
        } while (lVar16 != 0x7d);
        goto LAB_00149751;
      }
      goto LAB_00149693;
    }
    goto LAB_0014997b;
  }
LAB_00149c03:
  NJD_remove_silent_node(njd);
  return;
  while (lVar16 = lVar16 + 8, lVar16 != 0xa0) {
LAB_00149594:
    pcVar3 = NJDNode_get_string(p_Var11);
    iVar1 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list5 + lVar16));
    if (iVar1 == 0) {
      NJDNode_set_chain_flag(p_Var11->prev,0);
      iVar1 = 1;
      goto LAB_00149625;
    }
  }
LAB_001495b9:
  lVar16 = 0;
  do {
    pcVar3 = NJDNode_get_string(p_Var11->prev);
    iVar1 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list5 + lVar16));
    if (iVar1 == 0) {
      lVar16 = 0;
      goto LAB_001495ea;
    }
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0xa0);
LAB_001494cc:
  iVar1 = search_numerative_class(njd_set_digit_rule_numeral_list8,p_Var11);
  if (iVar1 != 0) {
    convert_digit_pron(njd_set_digit_rule_numeral_list9,p_Var11->prev);
  }
  iVar1 = search_numerative_class(njd_set_digit_rule_numeral_list10,p_Var11);
  if (iVar1 != 0) {
    convert_digit_pron(njd_set_digit_rule_numeral_list11,p_Var11->prev);
  }
  iVar1 = search_numerative_class(njd_set_digit_rule_numeral_list6,p_Var11);
  if (iVar1 != 0) {
    convert_numerative_pron(njd_set_digit_rule_numeral_list7,p_Var11->prev,p_Var11);
  }
LAB_00149534:
  p_Var11 = p_Var11->next;
  if (p_Var11 == (_NJDNode *)0x0) goto LAB_00149632;
  goto LAB_0014949d;
LAB_001495ea:
  pcVar3 = NJDNode_get_string(p_Var11);
  iVar1 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list4 + lVar16));
  if (iVar1 != 0) goto code_r0x00149602;
  iVar1 = 0;
LAB_00149625:
  NJDNode_set_chain_flag(p_Var11,iVar1);
  goto LAB_001494cc;
code_r0x00149602:
  lVar16 = lVar16 + 8;
  if (lVar16 == 0x60) goto LAB_001494cc;
  goto LAB_001495ea;
LAB_00149632:
  p_Var8 = njd->head;
  goto LAB_0014963a;
  while (lVar16 = lVar16 + 4, lVar16 != 8) {
LAB_0014979e:
    pcVar3 = NJDNode_get_string(p_Var8);
    iVar1 = strcmp(pcVar3,njd_set_digit_rule_conv_table3[lVar16]);
    if (iVar1 == 0) {
      pcVar3 = njd_set_digit_rule_conv_table3[lVar16 + 1];
      pcVar5 = njd_set_digit_rule_conv_table3[lVar16 + 2];
      NJDNode_set_read(p_Var8,pcVar3);
      NJDNode_set_pron(p_Var8,pcVar3);
      iVar1 = atoi(pcVar5);
      NJDNode_set_acc(p_Var8,iVar1);
      iVar1 = atoi(njd_set_digit_rule_conv_table3[lVar16 + 3]);
      NJDNode_set_mora_size(p_Var8,iVar1);
      break;
    }
  }
LAB_00149751:
  pcVar3 = NJDNode_get_string(p_Var8->next);
  iVar1 = strcmp(pcVar3,anon_var_dwarf_128d4d);
  if (iVar1 == 0) {
    lVar16 = 0;
    do {
      pcVar3 = NJDNode_get_string(p_Var8);
      iVar1 = strcmp(pcVar3,njd_set_digit_rule_conv_table4[lVar16]);
      if (iVar1 == 0) {
        NJDNode_load(p_Var8,njd_set_digit_rule_conv_table4[lVar16 + 1]);
        NJDNode_set_pron(p_Var8->next,(char *)0x0);
        break;
      }
      lVar16 = lVar16 + 2;
    } while (lVar16 != 4);
  }
  pcVar3 = NJDNode_get_string(p_Var8->next);
  iVar1 = strcmp(pcVar3,anon_var_dwarf_128d58);
  if ((iVar1 == 0) && ((pcVar3 = NJDNode_get_string(p_Var8), *pcVar3 != '*' || (pcVar3[1] != '\0')))
     ) {
    if (p_Var8->prev != (NJDNode *)0x0) {
      pcVar3 = NJDNode_get_string(p_Var8->prev);
      pcVar3 = strstr(pcVar3,anon_var_dwarf_1295f8 + 3);
      if (pcVar3 != (char *)0x0) {
        pcVar3 = NJDNode_get_string(p_Var8);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_128d6e);
        if (iVar1 == 0) {
          pcVar3 = anon_var_dwarf_128d79;
LAB_0014995a:
          NJDNode_load(p_Var8,pcVar3);
          NJDNode_set_pron(p_Var8->next,(char *)0x0);
          goto LAB_00149693;
        }
      }
    }
    lVar16 = 1;
    do {
      pcVar3 = NJDNode_get_string(p_Var8);
      iVar1 = strcmp(pcVar3,njd_set_digit_rule_conv_table4[lVar16 + 5]);
      if (iVar1 == 0) {
        ppcVar13 = njd_set_digit_rule_conv_table5;
LAB_00149953:
        pcVar3 = ppcVar13[lVar16];
        goto LAB_0014995a;
      }
      lVar16 = lVar16 + 2;
    } while (lVar16 != 0x15);
  }
  else {
    pcVar3 = NJDNode_get_string(p_Var8->next);
    iVar1 = strcmp(pcVar3,anon_var_dwarf_128d90);
    if (iVar1 == 0) {
      lVar16 = 1;
      do {
        pcVar3 = NJDNode_get_string(p_Var8);
        iVar1 = strcmp(pcVar3,njd_set_digit_rule_conv_table5[lVar16 + 0x15]);
        if (iVar1 == 0) {
          ppcVar13 = njd_set_digit_rule_conv_table6;
          goto LAB_00149953;
        }
        lVar16 = lVar16 + 2;
      } while (lVar16 != 0x15);
    }
  }
LAB_00149693:
  p_Var8 = p_Var8->next;
  if (p_Var8 == (_NJDNode *)0x0) goto LAB_0014997b;
  goto LAB_0014965f;
LAB_0014997b:
  for (pNVar12 = njd->head; pNVar12 != (NJDNode *)0x0; pNVar12 = pNVar12->next) {
    if (pNVar12->prev == (NJDNode *)0x0) {
LAB_001499c9:
      if ((pNVar12->next != (_NJDNode *)0x0) && (pNVar12->next->next != (_NJDNode *)0x0)) {
        pp_Var15 = &pNVar12->next;
        pcVar3 = NJDNode_get_string(pNVar12);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_128d9b);
        if (iVar1 == 0) {
          pcVar3 = NJDNode_get_string(*pp_Var15);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_128da6);
          if (iVar1 != 0) goto LAB_00149a18;
          pcVar3 = NJDNode_get_string((*pp_Var15)->next);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_128d58);
          if (iVar1 == 0) {
            pcVar3 = anon_var_dwarf_128db1;
          }
          else {
            pcVar3 = NJDNode_get_string((*pp_Var15)->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_128d90);
            if (iVar1 != 0) goto LAB_00149bbc;
            pcVar3 = anon_var_dwarf_128dc8;
          }
          goto LAB_00149b9d;
        }
LAB_00149a18:
        pcVar3 = NJDNode_get_string(pNVar12);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_128cd2);
        if (iVar1 == 0) {
          pcVar3 = NJDNode_get_string(*pp_Var15);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_128d9b);
          if (iVar1 == 0) {
            pcVar3 = NJDNode_get_string((*pp_Var15)->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_128d58);
            if (iVar1 == 0) {
              pcVar3 = anon_var_dwarf_128ddf;
LAB_00149b9d:
              NJDNode_load(pNVar12,pcVar3);
              NJDNode_set_pron(pNVar12->next,(char *)0x0);
            }
            else {
              pcVar3 = NJDNode_get_string((*pp_Var15)->next);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_128d90);
              if (iVar1 == 0) {
                pcVar3 = anon_var_dwarf_128dea;
                goto LAB_00149b9d;
              }
              pcVar3 = NJDNode_get_string((*pp_Var15)->next);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_128da6);
              if ((iVar1 != 0) || (pNVar14 = (*pp_Var15)->next->next, pNVar14 == (NJDNode *)0x0))
              goto LAB_00149bbc;
              pcVar3 = NJDNode_get_string(pNVar14);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_128d58);
              if (iVar1 == 0) {
                NJDNode_load(pNVar12,anon_var_dwarf_128df5);
                p_Var8 = pNVar12->next;
                pcVar3 = anon_var_dwarf_128e00;
              }
              else {
                pcVar3 = NJDNode_get_string((*pp_Var15)->next->next);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_128d90);
                if (iVar1 != 0) goto LAB_00149bbc;
                NJDNode_load(pNVar12,anon_var_dwarf_128df5);
                p_Var8 = pNVar12->next;
                pcVar3 = anon_var_dwarf_128e17;
              }
              NJDNode_load(p_Var8,pcVar3);
              NJDNode_set_pron(pNVar12->next->next,(char *)0x0);
              pp_Var15 = &pNVar12->next->next;
            }
            NJDNode_set_pron((*pp_Var15)->next,(char *)0x0);
          }
        }
      }
    }
    else {
      pcVar3 = NJDNode_get_pos_group1(pNVar12->prev);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_12a8a7 + 9);
      if (iVar1 != 0) goto LAB_001499c9;
    }
LAB_00149bbc:
  }
  goto LAB_00149c03;
}

Assistant:

void njd_set_digit(NJD * njd)
{
   int i, j;
   NJDNode *s = NULL;
   NJDNode *e = NULL;
   NJDNode *node;
   int find = 0;

   /* convert digit sequence */
   for (node = njd->head; node != NULL; node = node->next) {
      if (find == 0 && strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0)
         find = 1;
      if (get_digit(node, 1) >= 0 ||
          (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0 &&
           (is_period(NJDNode_get_string(node)) == 1 || is_comma(NJDNode_get_string(node)) == 1)
          )) {
         if (s == NULL)
            s = node;
         if (node == njd->tail)
            e = node;
      } else {
         if (s != NULL)
            e = node->prev;
      }
      if (s != NULL && e != NULL) {
         convert_digit_sequence(njd, s, e);
         s = e = NULL;
      }
   }
   if (find == 0)
      return;
   NJD_remove_silent_node(njd);
   if (njd->head == NULL)
      return;

   for (node = njd->head->next; node != NULL && node->next != NULL;) {
      if (strcmp(NJDNode_get_string(node), "*") != 0
          && strcmp(NJDNode_get_string(node->prev), "*") != 0
          && is_period(NJDNode_get_string(node)) == 1
          && strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0
          && strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_DIGIT_KAZU) == 0) {
         NJDNode_load(node, NJD_SET_DIGIT_TEN_FEATURE);
         NJDNode_set_chain_flag(node, 1);
         if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_ZERO1) == 0
             || strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_ZERO2) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_ZERO_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_TWO) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_TWO_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_FIVE) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_FIVE_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_SIX) == 0) {
            NJDNode_set_acc(node->prev, 1);
         }
         /* skip digit sequence */
         node = node->next;
         while (node && strcmp(NJDNode_get_pos(node), NJD_SET_DIGIT_MEISHI) == 0)
            node = node->next;
         if (node)
            node = node->next;
      } else {
         node = node->next;
      }
   }

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0) {
         if (strcmp(NJDNode_get_pos_group2(node), NJD_SET_DIGIT_JOSUUSHI) == 0
             || strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_FUKUSHIKANOU) == 0) {
            /* convert digit pron */
            if (search_numerative_class(njd_set_digit_rule_numerative_class1b, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1b, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1c1, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1c1, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1c2, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1c2, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1d, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1d, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1e, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1e, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1f, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1f, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1g, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1g, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1h, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1h, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1i, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1i, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1j, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1j, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1k, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1k, node->prev);
            /* convert numerative pron */
            if (search_numerative_class(njd_set_digit_rule_numerative_class2b, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2b, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2c, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2c, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2d, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2d, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2e, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2e, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2f, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2f, node->prev, node);
            /* modify accent phrase */
            NJDNode_set_chain_flag(node->prev, 0);
            NJDNode_set_chain_flag(node, 1);
         }
      }
   }

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0) {
         if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0
             && NJDNode_get_string(node->prev) != NULL && NJDNode_get_string(node) != NULL) {
            /* modify accent phrase */
            find = 0;
            for (i = 0; njd_set_digit_rule_numeral_list4[i] != NULL; i++) {
               if (strcmp(NJDNode_get_string(node->prev), njd_set_digit_rule_numeral_list4[i]) == 0) {
                  for (j = 0; njd_set_digit_rule_numeral_list5[j] != NULL; j++) {
                     if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_numeral_list5[j]) == 0) {
                        NJDNode_set_chain_flag(node->prev, 0);
                        NJDNode_set_chain_flag(node, 1);
                        find = 1;
                        break;
                     }
                  }
                  break;
               }
            }
            if (find == 0) {
               for (i = 0; njd_set_digit_rule_numeral_list5[i] != NULL; i++) {
                  if (strcmp(NJDNode_get_string(node->prev), njd_set_digit_rule_numeral_list5[i]) ==
                      0) {
                     for (j = 0; njd_set_digit_rule_numeral_list4[j] != NULL; j++) {
                        if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_numeral_list4[j]) ==
                            0) {
                           NJDNode_set_chain_flag(node, 0);
                           break;
                        }
                     }
                     break;
                  }
               }
            }
         }
         if (search_numerative_class(njd_set_digit_rule_numeral_list8, node) == 1)
            convert_digit_pron(njd_set_digit_rule_numeral_list9, node->prev);
         if (search_numerative_class(njd_set_digit_rule_numeral_list10, node) == 1)
            convert_digit_pron(njd_set_digit_rule_numeral_list11, node->prev);
         if (search_numerative_class(njd_set_digit_rule_numeral_list6, node) == 1)
            convert_numerative_pron(njd_set_digit_rule_numeral_list7, node->prev, node);
      }
   }

   for (node = njd->head; node != NULL; node = node->next) {
      if (node->next != NULL &&
          strcmp(NJDNode_get_string(node->next), "*") != 0 &&
          strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0 &&
          (node->prev == NULL
           || strcmp(NJDNode_get_pos(node->prev), NJD_SET_DIGIT_KIGOU) == 0
           || strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) != 0)
          && (strcmp(NJDNode_get_pos_group2(node->next), NJD_SET_DIGIT_JOSUUSHI) == 0
              || strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_DIGIT_FUKUSHIKANOU) == 0)) {
         /* convert class3 */
         for (i = 0; njd_set_digit_rule_numerative_class3[i] != NULL; i += 2) {
            if (strcmp(NJDNode_get_string(node->next), njd_set_digit_rule_numerative_class3[i]) == 0
                && strcmp(NJDNode_get_read(node->next),
                          njd_set_digit_rule_numerative_class3[i + 1]) == 0) {
               for (j = 0; njd_set_digit_rule_conv_table3[j] != NULL; j += 4) {
                  if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table3[j]) == 0) {
                     NJDNode_set_read(node, (char *) njd_set_digit_rule_conv_table3[j + 1]);
                     NJDNode_set_pron(node, (char *) njd_set_digit_rule_conv_table3[j + 1]);
                     NJDNode_set_acc(node, atoi(njd_set_digit_rule_conv_table3[j + 2]));
                     NJDNode_set_mora_size(node, atoi(njd_set_digit_rule_conv_table3[j + 3]));
                     break;
                  }
               }
               break;
            }
         }
         /* person */
         if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NIN) == 0) {
            for (i = 0; njd_set_digit_rule_conv_table4[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table4[i]) == 0) {
                  NJDNode_load(node, (char *) njd_set_digit_rule_conv_table4[i + 1]);
                  NJDNode_set_pron(node->next, NULL);
                  break;
               }
            }
         }
         /* the day of month */
         if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NICHI) == 0
             && strcmp(NJDNode_get_string(node), "*") != 0) {
            if (node->prev != NULL
                && strstr(NJDNode_get_string(node->prev), NJD_SET_DIGIT_GATSU) != NULL
                && strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_ONE) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_TSUITACHI);
               NJDNode_set_pron(node->next, NULL);
            } else {
               for (i = 0; njd_set_digit_rule_conv_table5[i] != NULL; i += 2) {
                  if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table5[i]) == 0) {
                     NJDNode_load(node, (char *) njd_set_digit_rule_conv_table5[i + 1]);
                     NJDNode_set_pron(node->next, NULL);
                     break;
                  }
               }
            }
         } else if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
            for (i = 0; njd_set_digit_rule_conv_table6[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table6[i]) == 0) {
                  NJDNode_load(node, (char *) njd_set_digit_rule_conv_table6[i + 1]);
                  NJDNode_set_pron(node->next, NULL);
                  break;
               }
            }
         }
      }
   }

   for (node = njd->head; node != NULL; node = node->next) {
      if ((node->prev == NULL
           || strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) != 0)
          && node->next != NULL && node->next->next != NULL) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TEN) == 0
             && strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_FOUR) == 0) {
            if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHI) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_JUYOKKA);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_JUYOKKAKAN);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TWO) == 0
                    && strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_TEN) == 0) {
            if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHI) == 0) {
               NJDNode_load(node, NJD_SET_DITIT_HATSUKA);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_HATSUKAKAN);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_FOUR) == 0
                       && node->next->next->next != NULL) {
               if (strcmp(NJDNode_get_string(node->next->next->next), NJD_SET_DIGIT_NICHI) == 0) {
                  NJDNode_load(node, NJD_SET_DIGIT_NIJU);
                  NJDNode_load(node->next, NJD_SET_DITIT_YOKKA);
                  NJDNode_set_pron(node->next->next, NULL);
                  NJDNode_set_pron(node->next->next->next, NULL);
               } else if (strcmp(NJDNode_get_string(node->next->next->next), NJD_SET_DIGIT_NICHIKAN)
                          == 0) {
                  NJDNode_load(node, NJD_SET_DIGIT_NIJU);
                  NJDNode_load(node->next, NJD_SET_DIGIT_YOKKAKAN);
                  NJDNode_set_pron(node->next->next, NULL);
                  NJDNode_set_pron(node->next->next->next, NULL);
               }
            }
         }
      }
   }

   NJD_remove_silent_node(njd);
   if (njd->head == NULL)
      return;
}